

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double poisson_cdf(int k,double a)

{
  double local_40;
  double next;
  double last;
  double dStack_28;
  int i;
  double cdf;
  double a_local;
  double dStack_10;
  int k_local;
  
  if (0.0 < a) {
    if (k < 0) {
      dStack_10 = 0.0;
    }
    else {
      local_40 = exp(-a);
      dStack_28 = local_40;
      for (last._4_4_ = 1; last._4_4_ <= k; last._4_4_ = last._4_4_ + 1) {
        local_40 = (local_40 * a) / (double)last._4_4_;
        dStack_28 = dStack_28 + local_40;
      }
      dStack_10 = dStack_28;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"POISSON_CDF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  A <= 0.\n");
    dStack_10 = 0.0;
  }
  return dStack_10;
}

Assistant:

double poisson_cdf ( int k, double a )

//****************************************************************************80
//
//  Purpose:
//
//    POISSON_CDF evaluates the Poisson CDF.
//
//  Discussion:
//
//    CDF(K,A) is the probability that the number of events observed
//    in a unit time period will be no greater than K, given that the
//    expected number of events in a unit time period is A.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    28 January 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int K, the argument of the CDF.
//
//    Input, double A, the parameter of the PDF.
//    0 < A.
//
//    Output, double POISSON_CDF, the value of the CDF.
//
{
  double cdf;
  int i;
  double last;
  double next;
//
//  Check.
//
  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "POISSON_CDF - Fatal error!\n";
    cerr << "  A <= 0.\n";
    return 0;
  }
//
//  Special cases.
//
  if ( k < 0 )
  {
    cdf = 0.0;
    return cdf;
  }
//
//  General case.
//
  next = exp ( - a );
  cdf = next;

  for ( i = 1; i <= k; i++ )
  {
    last = next;
    next = last * a / static_cast< double > ( i);
    cdf = cdf + next;
  }

  return cdf;
}